

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::TexSubImage2DEmptyTexCase::createTexture(TexSubImage2DEmptyTexCase *this)

{
  ContextWrapper *this_00;
  deUint32 type;
  Vec4 *maxVal;
  TextureFormatInfo *minVal;
  deUint32 dVar1;
  int ndx;
  int iVar2;
  int iVar3;
  int iVar4;
  deUint32 tex;
  TexSubImage2DEmptyTexCase *local_d8;
  int local_cc;
  ContextWrapper *local_c8;
  Vec4 *local_c0;
  TextureFormatInfo *local_b8;
  Random rnd;
  TextureLevel data;
  Vec4 gMax;
  Vec4 gMin;
  PixelBufferAccess local_58;
  
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&(this->super_Texture2DSpecCase).m_texFormat);
  dVar1 = deStringHash((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar1);
  this_00 = &(this->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
  sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
  sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
  for (iVar2 = 0; iVar3 = (this->super_Texture2DSpecCase).m_numLevels, iVar2 < iVar3;
      iVar2 = iVar2 + 1) {
    iVar3 = (this->super_Texture2DSpecCase).m_width >> ((byte)iVar2 & 0x1f);
    if (iVar3 < 2) {
      iVar3 = 1;
    }
    iVar4 = (this->super_Texture2DSpecCase).m_height >> ((byte)iVar2 & 0x1f);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    sglr::ContextWrapper::glTexImage2D
              (this_00,0xde1,iVar2,*(int *)&(this->super_Texture2DSpecCase).field_0xd4,iVar3,iVar4,0
               ,this->m_format,this->m_dataType,(void *)0x0);
  }
  local_b8 = &(this->super_Texture2DSpecCase).m_texFormatInfo;
  local_c0 = &(this->super_Texture2DSpecCase).m_texFormatInfo.valueMax;
  local_d8 = this;
  local_c8 = this_00;
  for (iVar2 = 0; minVal = local_b8, maxVal = local_c0, iVar2 < iVar3; iVar2 = iVar2 + 1) {
    iVar3 = (local_d8->super_Texture2DSpecCase).m_width >> ((byte)iVar2 & 0x1f);
    if (iVar3 < 2) {
      iVar3 = 1;
    }
    iVar4 = (local_d8->super_Texture2DSpecCase).m_height >> ((byte)iVar2 & 0x1f);
    if (iVar4 < 2) {
      iVar4 = 1;
    }
    local_cc = iVar2;
    randomVector<4>((Functional *)&gMin,&rnd,&local_b8->valueMin,local_c0);
    randomVector<4>((Functional *)&gMax,&rnd,&minVal->valueMin,maxVal);
    tcu::TextureLevel::setSize(&data,iVar3,iVar4,1);
    tcu::TextureLevel::getAccess(&local_58,&data);
    tcu::fillWithComponentGradients(&local_58,&gMin,&gMax);
    dVar1 = local_d8->m_format;
    type = local_d8->m_dataType;
    tcu::TextureLevel::getAccess(&local_58,&data);
    iVar2 = local_cc;
    sglr::ContextWrapper::glTexSubImage2D
              (local_c8,0xde1,local_cc,0,0,iVar3,iVar4,dVar1,type,
               local_58.super_ConstPixelBufferAccess.m_data);
    iVar3 = (local_d8->super_Texture2DSpecCase).m_numLevels;
  }
  tcu::TextureLevel::~TextureLevel(&data);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	data		(m_texFormat);
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First allocate storage for each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_internalFormat, levelW, levelH, 0, m_format, m_dataType, DE_NULL);
		}

		// Specify pixel data to all levels using glTexSubImage2D()
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);
			Vec4	gMin		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
			Vec4	gMax		= randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

			data.setSize(levelW, levelH);
			tcu::fillWithComponentGradients(data.getAccess(), gMin, gMax);

			glTexSubImage2D(GL_TEXTURE_2D, ndx, 0, 0, levelW, levelH, m_format, m_dataType, data.getAccess().getDataPtr());
		}
	}